

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  String local_28;
  wchar_t *local_18;
  wchar_t *wide_c_str_local;
  Message *this_local;
  
  local_18 = wide_c_str;
  wide_c_str_local = (wchar_t *)this;
  internal::String::ShowWideCString(&local_28,wide_c_str);
  pMVar1 = operator<<(this,&local_28);
  internal::String::~String((String *)this);
  return pMVar1;
}

Assistant:

Message& operator <<(const wchar_t* wide_c_str) {
    return *this << internal::String::ShowWideCString(wide_c_str);
  }